

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorPoolDatabase::FindFileContainingExtension
          (DescriptorPoolDatabase *this,string *containing_type,int field_number,
          FileDescriptorProto *output)

{
  Descriptor *extendee;
  FieldDescriptor *pFVar1;
  bool bVar2;
  
  extendee = DescriptorPool::FindMessageTypeByName(this->pool_,containing_type);
  if (extendee == (Descriptor *)0x0) {
    bVar2 = false;
  }
  else {
    pFVar1 = DescriptorPool::FindExtensionByNumber(this->pool_,extendee,field_number);
    bVar2 = pFVar1 != (FieldDescriptor *)0x0;
    if (bVar2) {
      FileDescriptorProto::Clear(output);
      FileDescriptor::CopyTo(*(FileDescriptor **)(pFVar1 + 0x30),output);
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool DescriptorPoolDatabase::FindFileContainingExtension(
    const string& containing_type,
    int field_number,
    FileDescriptorProto* output) {
  const Descriptor* extendee = pool_.FindMessageTypeByName(containing_type);
  if (extendee == NULL) return false;

  const FieldDescriptor* extension =
    pool_.FindExtensionByNumber(extendee, field_number);
  if (extension == NULL) return false;

  output->Clear();
  extension->file()->CopyTo(output);
  return true;
}